

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoluj.c
# Opt level: O0

int ffpgpujj(fitsfile *fptr,long group,long firstelem,long nelem,ULONGLONG *array,int *status)

{
  LONGLONG local_48;
  long row;
  int *status_local;
  ULONGLONG *array_local;
  long nelem_local;
  long firstelem_local;
  long group_local;
  fitsfile *fptr_local;
  
  local_48 = group;
  if (group < 1) {
    local_48 = 1;
  }
  ffpclujj(fptr,1,local_48,firstelem,nelem,array,status);
  return *status;
}

Assistant:

int ffpgpujj( fitsfile *fptr,   /* I - FITS file pointer                    */
            long  group,      /* I - group to write(1 = 1st group)          */
            long  firstelem,  /* I - first vector element to write(1 = 1st) */
            long  nelem,      /* I - number of values to write              */
            ULONGLONG  *array,     /* I - array of values that are written  */
            int  *status)     /* IO - error status                          */
/*
  Write an array of group parameters to the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being written).
*/
{
    long row;

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    row=maxvalue(1,group);

    ffpclujj(fptr, 1L, row, firstelem, nelem, array, status);
    return(*status);
}